

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void * Eigen::internal::aligned_malloc(size_t size)

{
  bool bVar1;
  void *pvVar2;
  void *result;
  size_t size_local;
  
  check_that_malloc_is_allowed();
  pvVar2 = malloc(size);
  if ((size < 0x10) || (bVar1 = false, ((ulong)pvVar2 & 0xf) == 0)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/util/Memory.h"
                  ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if ((pvVar2 == (void *)0x0) && (size != 0)) {
    throw_std_bad_alloc();
  }
  return pvVar2;
}

Assistant:

EIGEN_DEVICE_FUNC inline void* aligned_malloc(std::size_t size)
{
  check_that_malloc_is_allowed();

  void *result;
  #if (EIGEN_DEFAULT_ALIGN_BYTES==0) || EIGEN_MALLOC_ALREADY_ALIGNED
    result = std::malloc(size);
    #if EIGEN_DEFAULT_ALIGN_BYTES==16
    eigen_assert((size<16 || (std::size_t(result)%16)==0) && "System's malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.");
    #endif
  #else
    result = handmade_aligned_malloc(size);
  #endif

  if(!result && size)
    throw_std_bad_alloc();

  return result;
}